

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_line_reporter.h
# Opt level: O2

void __thiscall bandit::detail::single_line_reporter::test_run_complete(single_line_reporter *this)

{
  void *__buf;
  colorizer *colorizer;
  test_run_summary summary;
  
  std::endl<char,std::char_traits<char>>(this->stm_);
  colorizer = this->colorizer_;
  test_run_summary::test_run_summary
            (&summary,(this->super_progress_reporter).specs_run_,
             (this->super_progress_reporter).specs_failed_,
             (this->super_progress_reporter).specs_succeeded_,
             (this->super_progress_reporter).specs_skipped_,
             &(this->super_progress_reporter).failures_,
             &(this->super_progress_reporter).test_run_errors_,colorizer);
  test_run_summary::write(&summary,(int)this->stm_,__buf,(size_t)colorizer);
  test_run_summary::~test_run_summary(&summary);
  return;
}

Assistant:

void test_run_complete() 
    {
      progress_reporter::test_run_complete();

      stm_ << std::endl;

      test_run_summary summary(specs_run_, specs_failed_, specs_succeeded_, specs_skipped_, failures_, 
          test_run_errors_, colorizer_);
      summary.write(stm_);
    }